

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::HinOut(HinOut *this,string *filenameIn,string *filenameOut)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  HPreData *in_stack_00000070;
  
  HPreData::HPreData(in_stack_00000070);
  std::__cxx11::string::string((string *)(in_RDI + 0x7b0));
  std::__cxx11::string::string((string *)(in_RDI + 2000));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bc123);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bc139);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc14f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc165);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc17b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc191);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc1a7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bc1bd);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x7b0),in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 2000),in_RDX);
  poVar1 = std::operator<<((ostream *)&std::cout,"File in is ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"File out is ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  *(undefined4 *)(in_RDI + 0x8c0) = 0;
  *(undefined4 *)(in_RDI + 0x7a8) = 0;
  return;
}

Assistant:

HinOut::HinOut(string filenameIn, string filenameOut) {
	fileIn = filenameIn;
	fileOut = filenameOut;

	cout<<"File in is "<<filenameIn << endl;
	cout<<"File out is "<<filenameOut<< endl;
	oAcountX = 0;
	AcountX = 0;
}